

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_extension_callback_pm_deflate
              (lws_context *context,lws_extension *ext,lws *wsi,
              lws_extension_callback_reasons reason,void *user,void *in,size_t len)

{
  void *in_local;
  void *user_local;
  lws_extension_callback_reasons reason_local;
  lws *wsi_local;
  lws_extension *ext_local;
  lws_context *context_local;
  
  return 0;
}

Assistant:

int
lws_extension_callback_pm_deflate(struct lws_context *context,
                                  const struct lws_extension *ext,
                                  struct lws *wsi,
                                  enum lws_extension_callback_reasons reason,
                                  void *user, void *in, size_t len)
{
	(void)context;
	(void)ext;
	(void)wsi;
	(void)reason;
	(void)user;
	(void)in;
	(void)len;

	return 0;
}